

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int integrityCheckResultRow(Vdbe *v)

{
  int iVar1;
  Vdbe *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Vdbe *in_stack_00000008;
  int addr;
  undefined8 in_stack_ffffffffffffffe8;
  int op;
  undefined4 in_stack_fffffffffffffff0;
  Vdbe *pVVar2;
  
  sqlite3VdbeAddOp2((Vdbe *)CONCAT44(0xaaaaaaaa,in_stack_fffffffffffffff0),
                    (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,0
                   );
  pVVar2 = in_RDI;
  sqlite3VdbeCurrentAddr(in_RDI);
  op = (int)((ulong)in_RDI >> 0x20);
  iVar1 = sqlite3VdbeAddOp3(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                            (int)((ulong)pVVar2 >> 0x20),(int)pVVar2);
  sqlite3VdbeAddOp0((Vdbe *)CONCAT44(iVar1,in_stack_fffffffffffffff0),op);
  return iVar1;
}

Assistant:

static int integrityCheckResultRow(Vdbe *v){
  int addr;
  sqlite3VdbeAddOp2(v, OP_ResultRow, 3, 1);
  addr = sqlite3VdbeAddOp3(v, OP_IfPos, 1, sqlite3VdbeCurrentAddr(v)+2, 1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp0(v, OP_Halt);
  return addr;
}